

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::CollectNonSemanticTree
          (IRContext *this,Instruction *inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *to_kill)

{
  Instruction *def;
  bool bVar1;
  DefUseManager *this_00;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  Instruction *inst_local;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  seen;
  
  if (inst->has_result_id_ == true) {
    inst_local = inst;
    bVar1 = Instruction::IsDebugLineInst(inst);
    if (!bVar1) {
      work_list.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      work_list.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      work_list.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
      seen._M_h._M_bucket_count = 1;
      seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      seen._M_h._M_element_count = 0;
      seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      seen._M_h._M_rehash_policy._M_next_resize = 0;
      seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&work_list,&inst_local);
      while (work_list.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             work_list.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        def = work_list.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
        work_list.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             work_list.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        this_00 = get_def_use_mgr(this);
        local_88._8_8_ = 0;
        local_88._M_unused._M_object = operator_new(0x18);
        *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
         local_88._M_unused._0_8_ = &work_list;
        *(unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          **)((long)local_88._M_unused._0_8_ + 8) = to_kill;
        *(unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          **)((long)local_88._M_unused._0_8_ + 0x10) = &seen;
        local_70 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:261:12)>
                   ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:261:12)>
                   ::_M_manager;
        analysis::DefUseManager::ForEachUser
                  (this_00,def,(function<void_(spvtools::opt::Instruction_*)> *)&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
      }
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&seen._M_h);
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&work_list.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
    }
  }
  return;
}

Assistant:

void IRContext::CollectNonSemanticTree(
    Instruction* inst, std::unordered_set<Instruction*>* to_kill) {
  if (!inst->HasResultId()) return;
  // Debug[No]Line result id is not used, so we are done
  if (inst->IsDebugLineInst()) return;
  std::vector<Instruction*> work_list;
  std::unordered_set<Instruction*> seen;
  work_list.push_back(inst);

  while (!work_list.empty()) {
    auto* i = work_list.back();
    work_list.pop_back();
    get_def_use_mgr()->ForEachUser(
        i, [&work_list, to_kill, &seen](Instruction* user) {
          if (user->IsNonSemanticInstruction() && seen.insert(user).second) {
            work_list.push_back(user);
            to_kill->insert(user);
          }
        });
  }
}